

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O1

PrecisionRecallCurve *
google::protobuf::Arena::CreateMessageInternal<CoreML::Specification::PrecisionRecallCurve>
          (Arena *arena)

{
  PrecisionRecallCurve *this;
  
  if (arena == (Arena *)0x0) {
    this = (PrecisionRecallCurve *)operator_new(0x38);
    CoreML::Specification::PrecisionRecallCurve::PrecisionRecallCurve(this,(Arena *)0x0,false);
  }
  else {
    this = (PrecisionRecallCurve *)
           AllocateAlignedWithHook
                     (arena,0x38,(type_info *)&CoreML::Specification::PrecisionRecallCurve::typeinfo
                     );
    CoreML::Specification::PrecisionRecallCurve::PrecisionRecallCurve(this,arena,false);
  }
  return this;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }